

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

bool density::detail::
     LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
     ::same_page(void *i_first,void *i_second)

{
  size_t page_mask;
  void *i_second_local;
  void *i_first_local;
  
  return (((ulong)i_first ^ (ulong)i_second) & 0xffffffffffff0000) == 0;
}

Assistant:

static bool same_page(const void * i_first, const void * i_second) noexcept
            {
                auto constexpr page_mask = ALLOCATOR_TYPE::page_alignment - 1;
                return ((reinterpret_cast<uintptr_t>(i_first) ^
                         reinterpret_cast<uintptr_t>(i_second)) &
                        ~page_mask) == 0;
            }